

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_add_elements_raw_input_at
              (wally_tx *tx,uint32_t index,uchar *txhash,size_t txhash_len,uint32_t utxo_index,
              uint32_t sequence,uchar *script,size_t script_len,wally_tx_witness_stack *witness,
              uchar *nonce,size_t nonce_len,uchar *entropy,size_t entropy_len,uchar *issuance_amount
              ,size_t issuance_amount_len,uchar *inflation_keys,size_t inflation_keys_len,
              uchar *issuance_amount_rangeproof,size_t issuance_amount_rangeproof_len,
              uchar *inflation_keys_rangeproof,size_t inflation_keys_rangeproof_len,
              wally_tx_witness_stack *pegin_witness,uint32_t flags,_Bool is_elements)

{
  _Bool _Var1;
  int ret;
  _Bool is_coinbase;
  wally_tx_input input;
  _Bool is_elements_local;
  uint32_t sequence_local;
  uint32_t utxo_index_local;
  size_t txhash_len_local;
  uchar *txhash_local;
  uint32_t index_local;
  wally_tx *tx_local;
  
  input.pegin_witness._7_1_ = is_elements;
  memset(&ret,0,0x20);
  input._32_8_ = script;
  input.script = (uchar *)script_len;
  input.script_len = (size_t)witness;
  input.witness._0_1_ = (input.pegin_witness._7_1_ & 1) != 0;
  input.txhash._24_4_ = utxo_index;
  input.txhash._28_4_ = sequence;
  memset((void *)((long)&input.witness + 1),0,0x20);
  memset(input.blinding_nonce + 0x18,0,0x20);
  input._128_8_ = issuance_amount;
  input.issuance_amount = (uchar *)issuance_amount_len;
  input.issuance_amount_len = (size_t)inflation_keys;
  input.inflation_keys = (uchar *)inflation_keys_len;
  input.inflation_keys_len = (size_t)issuance_amount_rangeproof;
  input.issuance_amount_rangeproof = (uchar *)issuance_amount_rangeproof_len;
  input.issuance_amount_rangeproof_len = (size_t)inflation_keys_rangeproof;
  input.inflation_keys_rangeproof = (uchar *)inflation_keys_rangeproof_len;
  input.inflation_keys_rangeproof_len = (size_t)pegin_witness;
  if (flags == 0) {
    if (((((txhash == (uchar *)0x0) || (txhash_len != 0x20)) ||
         ((nonce != (uchar *)0x0) != (nonce_len == 0x20))) ||
        (((entropy != (uchar *)0x0) != (entropy_len == 0x20) ||
         ((issuance_amount != (uchar *)0x0) != (issuance_amount_len != 0))))) ||
       (((inflation_keys != (uchar *)0x0) != (inflation_keys_len != 0) ||
        (((issuance_amount_rangeproof != (uchar *)0x0) != (issuance_amount_rangeproof_len != 0) ||
         ((inflation_keys_rangeproof != (uchar *)0x0) != (inflation_keys_rangeproof_len != 0)))))))
    {
      tx_local._4_4_ = -2;
    }
    else {
      _Var1 = is_coinbase_bytes(txhash,0x20,utxo_index);
      input.txhash._24_4_ = utxo_index;
      if (((input.pegin_witness._7_1_ & 1) != 0) && (!_Var1)) {
        input.txhash._24_4_ = utxo_index & 0x3fffffff;
      }
      if (_Var1) {
        input.witness._0_1_ = (byte)input.witness | 8;
      }
      else if ((input.pegin_witness._7_1_ & 1) != 0) {
        if ((utxo_index & 0x80000000) != 0) {
          input.witness._0_1_ = (byte)input.witness | 2;
        }
        if ((utxo_index & 0x40000000) != 0) {
          input.witness._0_1_ = (byte)input.witness | 4;
        }
      }
      _ret = *(undefined8 *)txhash;
      input.txhash._0_8_ = *(undefined8 *)(txhash + 8);
      input.txhash._8_8_ = *(undefined8 *)(txhash + 0x10);
      input.txhash._16_8_ = *(undefined8 *)(txhash + 0x18);
      if (nonce != (uchar *)0x0) {
        input._57_8_ = *(undefined8 *)nonce;
        input.blinding_nonce._0_8_ = *(undefined8 *)(nonce + 8);
        input.blinding_nonce._8_8_ = *(undefined8 *)(nonce + 0x10);
        input.blinding_nonce._16_8_ = *(undefined8 *)(nonce + 0x18);
      }
      if (entropy != (uchar *)0x0) {
        input.blinding_nonce._24_8_ = *(undefined8 *)entropy;
        input.entropy._0_8_ = *(undefined8 *)(entropy + 8);
        input.entropy._8_8_ = *(undefined8 *)(entropy + 0x10);
        input.entropy._16_8_ = *(undefined8 *)(entropy + 0x18);
      }
      tx_local._4_4_ = wally_tx_add_input_at(tx,index,(wally_tx_input *)&ret);
      wally_clear(&ret,0xd0);
    }
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

static int tx_add_elements_raw_input_at(
    struct wally_tx *tx, uint32_t index,
    const unsigned char *txhash, size_t txhash_len,
    uint32_t utxo_index, uint32_t sequence,
    const unsigned char *script, size_t script_len,
    const struct wally_tx_witness_stack *witness,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *entropy, size_t entropy_len,
    const unsigned char *issuance_amount, size_t issuance_amount_len,
    const unsigned char *inflation_keys, size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof, size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof, size_t inflation_keys_rangeproof_len,
    const struct wally_tx_witness_stack *pegin_witness,
    uint32_t flags, bool is_elements)
{
    /* Add an input without allocating a temporary wally_tx_input */
    struct wally_tx_input input = {
        { 0 }, utxo_index, sequence,
        (unsigned char *)script, script_len,
        (struct wally_tx_witness_stack *) witness,
        is_elements ? WALLY_TX_IS_ELEMENTS : 0,
#ifdef BUILD_ELEMENTS
        { 0 }, { 0 }, (unsigned char *) issuance_amount,
        issuance_amount_len,
        (unsigned char *) inflation_keys,
        inflation_keys_len,
        (unsigned char *) issuance_amount_rangeproof,
        issuance_amount_rangeproof_len,
        (unsigned char *) inflation_keys_rangeproof,
        inflation_keys_rangeproof_len,
        (struct wally_tx_witness_stack *) pegin_witness
#endif /* BUILD_ELEMENTS */
    };
    bool is_coinbase;
    int ret;
#ifndef BUILD_ELEMENTS
    (void)pegin_witness;
#endif

    if (flags)
        return WALLY_EINVAL; /* TODO: Allow creation of p2pkh/p2sh using flags */

    if (!txhash || txhash_len != WALLY_TXHASH_LEN ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID_N(entropy, entropy_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID(issuance_amount, issuance_amount_len) ||
        BYTES_INVALID(inflation_keys, inflation_keys_len) ||
        BYTES_INVALID(issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        BYTES_INVALID(inflation_keys_rangeproof, inflation_keys_rangeproof_len))
        return WALLY_EINVAL;

    is_coinbase = is_coinbase_bytes(txhash, txhash_len, utxo_index);
    if (is_elements && !is_coinbase)
        input.index = utxo_index & WALLY_TX_INDEX_MASK;
    else
        input.index = utxo_index;
    if (is_coinbase)
        input.features |= WALLY_TX_IS_COINBASE;
    else if (is_elements) {
        if (utxo_index & WALLY_TX_ISSUANCE_FLAG)
            input.features |= WALLY_TX_IS_ISSUANCE;
        if (utxo_index & WALLY_TX_PEGIN_FLAG)
            input.features |= WALLY_TX_IS_PEGIN;
    }

    memcpy(input.txhash, txhash, WALLY_TXHASH_LEN);
#ifdef BUILD_ELEMENTS
    if (nonce)
        memcpy(input.blinding_nonce, nonce, WALLY_TX_ASSET_TAG_LEN);
    if (entropy)
        memcpy(input.entropy, entropy, WALLY_TX_ASSET_TAG_LEN);
#endif /* BUILD_ELEMENTS */
    ret = wally_tx_add_input_at(tx, index, &input);
    wally_clear(&input, sizeof(input));
    return ret;
}